

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O2

void __thiscall
flagser_parameters::flagser_parameters(flagser_parameters *this,named_arguments_t *named_arguments)

{
  string *this_00;
  filtration_algorithm_t *pfVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  const_iterator cVar5;
  char *pcVar6;
  filtration_algorithm_t *pfVar7;
  float fVar8;
  string parameter;
  allocator local_111;
  key_type local_110;
  allocator local_e9;
  string *local_e8;
  string *local_e0;
  string *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->max_dimension = 0xffff;
  this->min_dimension = 0;
  this->modulus = 2;
  this->threshold = 3.4028235e+38;
  this->split_into_connected_components = false;
  this->directed = false;
  this->approximate_computation = false;
  this->in_memory = false;
  this->max_entries = 0xffffffffffffffff;
  uVar3 = std::thread::hardware_concurrency();
  this->nb_threads = (ulong)uVar3;
  local_e8 = &this->input_format;
  std::__cxx11::string::string((string *)local_e8,"flagser",(allocator *)&local_110);
  std::__cxx11::string::string((string *)&this->output_name,"",(allocator *)&local_110);
  this_00 = &this->output_format;
  std::__cxx11::string::string((string *)this_00,"barcode",(allocator *)&local_110);
  std::__cxx11::string::string((string *)&this->cache,"",(allocator *)&local_110);
  local_e0 = &this->hdf5_type;
  local_d8 = &this->cache;
  std::__cxx11::string::string((string *)local_e0,"",(allocator *)&local_110);
  (this->filtration_algorithm)._M_t.
  super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t.
  super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
  super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
       (filtration_algorithm_t *)0x0;
  std::__cxx11::string::string((string *)&local_50,"out",(allocator *)&local_110);
  std::__cxx11::string::string
            ((string *)&local_70,"Please provide an output filename via \"--out filename\" .",
             &local_111);
  get_argument_or_fail(named_arguments,&local_50,&local_70);
  std::__cxx11::string::assign((char *)&this->output_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_110,"in-format",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::assign((char *)local_e8);
  }
  std::__cxx11::string::string((string *)&local_110,"out-format",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::assign((char *)this_00);
  }
  std::__cxx11::string::string((string *)&local_110,"approximate",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar4 = atoi(*(char **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->max_entries = (long)iVar4;
    this->approximate_computation = true;
  }
  std::__cxx11::string::string((string *)&local_90,"undirected",&local_111);
  pcVar6 = get_argument_or_default(named_arguments,&local_90,"directed");
  std::__cxx11::string::string((string *)&local_110,pcVar6,&local_e9);
  bVar2 = std::operator!=(&local_110,"true");
  this->directed = bVar2;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_110,"components",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  this->split_into_connected_components =
       cVar5.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur != (__node_type *)0x0;
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_110,"max-dim",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar4 = atoi(*(char **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->max_dimension = (unsigned_short)iVar4;
  }
  std::__cxx11::string::string((string *)&local_110,"min-dim",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar4 = atoi(*(char **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->min_dimension = (unsigned_short)iVar4;
  }
  bVar2 = has_zero_filtration_and_no_explicit_output(this,named_arguments);
  if (bVar2) {
    std::__cxx11::string::assign((char *)this_00);
  }
  std::__cxx11::string::string((string *)&local_d0,"filtration",(allocator *)&local_110);
  pcVar6 = get_argument_or_default(named_arguments,&local_d0,"zero");
  std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_111);
  pfVar7 = get_filtration_computer(&local_b0);
  pfVar1 = (this->filtration_algorithm)._M_t.
           super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
           .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  (this->filtration_algorithm)._M_t.
  super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t.
  super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
  super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl = pfVar7;
  if (pfVar1 != (filtration_algorithm_t *)0x0) {
    (*pfVar1->_vptr_filtration_algorithm_t[1])();
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"threshold",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_110,
               *(char **)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                ._M_cur + 0x28),&local_111);
    fVar8 = std::__cxx11::stof(&local_110,(size_t *)0x0);
    this->threshold = fVar8;
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::string((string *)&local_110,"threads",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar4 = atoi(*(char **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->nb_threads = (long)iVar4;
  }
  std::__cxx11::string::string((string *)&local_110,"in-memory",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    this->in_memory = true;
  }
  std::__cxx11::string::string((string *)&local_110,"modulus",&local_111);
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments->_M_h,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    iVar4 = atoi(*(char **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28));
    this->modulus = (coefficient_t)iVar4;
  }
  return;
}

Assistant:

flagser_parameters(const named_arguments_t& named_arguments) {
		named_arguments_t::const_iterator it;

		output_name =
		    get_argument_or_fail(named_arguments, "out", "Please provide an output filename via \"--out filename\" .");

		if ((it = named_arguments.find("in-format")) != named_arguments.end()) { input_format = it->second; }

		if ((it = named_arguments.find("out-format")) != named_arguments.end()) { output_format = it->second; }

		if ((it = named_arguments.find("approximate")) != named_arguments.end()) {
			max_entries = atoi(it->second);
			approximate_computation = true;
		}

		directed = std::string(get_argument_or_default(named_arguments, "undirected", "directed")) != "true";

		split_into_connected_components = named_arguments.find("components") != named_arguments.end();

		if ((it = named_arguments.find("max-dim")) != named_arguments.end()) { max_dimension = atoi(it->second); }

		if ((it = named_arguments.find("min-dim")) != named_arguments.end()) { min_dimension = atoi(it->second); }

		if (has_zero_filtration_and_no_explicit_output(named_arguments)) { output_format = "betti"; }

		filtration_algorithm.reset(
		    get_filtration_computer(get_argument_or_default(named_arguments, "filtration", "zero")));

		if ((it = named_arguments.find("threshold")) != named_arguments.end()) {
			std::string parameter = std::string(it->second);
			threshold = std::stof(parameter, nullptr);
		}

		if ((it = named_arguments.find("threads")) != named_arguments.end()) { nb_threads = atoi(it->second); }

		if ((it = named_arguments.find("in-memory")) != named_arguments.end()) { in_memory = true; }

#ifdef USE_COEFFICIENTS
		if ((it = named_arguments.find("modulus")) != named_arguments.end()) { modulus = atoi(it->second); }
#endif
	}